

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O2

void __thiscall omp_reversed_const_move_case_Test::TestBody(omp_reversed_const_move_case_Test *this)

{
  char *in_R9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertHelper AStack_a8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> reversed_values;
  vector<int,_std::allocator<int>_> expecting;
  string local_68;
  AssertionResult gtest_ar_;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_30;
  vector<int,_std::allocator<int>_> values;
  
  local_68._M_dataplus._M_p = (pointer)0x400000001;
  local_68._M_string_length = 0x200000003;
  local_68.field_2._M_allocated_capacity._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&reversed_values);
  std::vector<int,_std::allocator<int>_>::vector(&reversed_values.container,&values);
  local_68._M_dataplus._M_p = (char *)0x200000005;
  local_68._M_string_length = 0x400000003;
  local_68.field_2._M_allocated_capacity._0_4_ = 1;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&expecting,__l_00,(allocator_type *)&gtest_ar_);
  local_30.current._M_current =
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       reversed_values.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.current._M_current =
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       reversed_values.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  gtest_ar_.success_ =
       std::
       equal<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                 (&local_30,&local_38,
                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x35,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_a0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expecting.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&reversed_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(omp_reversed, const_move_case) {
  const std::vector values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(std::move(values));

  std::vector expecting = {5, 2, 3, 4, 1};

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}